

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O1

void Io_WriteBook(Abc_Ntk_t *pNtk,char *FileName)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pNode;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  char *pcVar18;
  FILE *pFVar19;
  FILE *pFVar20;
  FILE *pFVar21;
  uint *puVar22;
  void *pvVar23;
  uint *puVar24;
  void *pvVar25;
  ProgressBar *p;
  uint *puVar26;
  int *piVar27;
  char *pcVar28;
  Vec_Ptr_t *pVVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  long *plVar35;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 uVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  long *plVar44;
  ulong uVar45;
  long *plVar46;
  bool bVar47;
  bool bVar48;
  ulong uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double local_128;
  double dStack_120;
  undefined8 *local_118;
  double dStack_110;
  long *local_108;
  uint local_f4;
  undefined4 local_88;
  ulong local_68;
  
  sVar17 = strlen(FileName);
  pcVar18 = (char *)calloc(sVar17 + 7,1);
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x6e,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  strcpy(pcVar18,FileName);
  sVar17 = strlen(pcVar18);
  builtin_strncpy(pcVar18 + sVar17,".nodes",7);
  pFVar19 = fopen(pcVar18,"w");
  strcpy(pcVar18,FileName);
  sVar17 = strlen(pcVar18);
  builtin_strncpy(pcVar18 + sVar17,".nets",6);
  pFVar20 = fopen(pcVar18,"w");
  strcpy(pcVar18,FileName);
  sVar17 = strlen(pcVar18);
  builtin_strncpy(pcVar18 + sVar17,".aux",5);
  pFVar21 = fopen(pcVar18,"w");
  if ((pFVar20 == (FILE *)0x0 || pFVar19 == (FILE *)0x0) || pFVar21 == (FILE *)0x0) {
    fclose(pFVar21);
    fwrite("Io_WriteBook(): Cannot open the output files.\n",0x2e,1,_stdout);
    return;
  }
  fprintf(pFVar21,"RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts",FileName,FileName,
          FileName,FileName,FileName);
  fclose(pFVar21);
  uVar12 = Io_NtkWriteNodes((FILE *)pFVar19,pNtk);
  Io_NtkWriteNets((FILE *)pFVar20,pNtk);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    uVar13 = Io_NtkWriteNodes((FILE *)pFVar19,pNtk);
    uVar12 = uVar12 + uVar13;
    Io_NtkWriteNets((FILE *)pFVar20,pNtk);
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x8f,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  if ((0 < pNtk->nObjCounts[10]) && (pVVar29 = pNtk->pDesign->vModules, 0 < pVVar29->nSize)) {
    lVar43 = 0;
    do {
      pNtk_00 = (Abc_Ntk_t *)pVVar29->pArray[lVar43];
      if (pNtk_00 != pNtk) {
        uVar13 = Io_NtkWriteNodes((FILE *)pFVar19,pNtk_00);
        uVar12 = uVar12 + uVar13;
        Io_NtkWriteNets((FILE *)pFVar20,pNtk_00);
      }
      lVar43 = lVar43 + 1;
      pVVar29 = pNtk->pDesign->vModules;
    } while (lVar43 < pVVar29->nSize);
  }
  fclose(pFVar19);
  fclose(pFVar20);
  strcpy(pcVar18,FileName);
  sVar17 = strlen(pcVar18);
  builtin_strncpy(pcVar18 + sVar17,".scl",5);
  pFVar19 = fopen(pcVar18,"w");
  strcpy(pcVar18,FileName);
  sVar17 = strlen(pcVar18);
  builtin_strncpy(pcVar18 + sVar17,".pl",4);
  pFVar20 = fopen(pcVar18,"w");
  strcpy(pcVar18,FileName);
  sVar17 = strlen(pcVar18);
  builtin_strncpy(pcVar18 + sVar17,".wts",5);
  pFVar21 = fopen(pcVar18,"w");
  if (pcVar18 != (char *)0x0) {
    free(pcVar18);
  }
  iVar37 = pNtk->nObjCounts[7];
  dVar4 = (double)uVar12 / 0.9;
  iVar1 = pNtk->nObjCounts[8];
  if (dVar4 < 0.0) {
    dVar5 = sqrt(dVar4);
  }
  else {
    dVar5 = SQRT(dVar4);
  }
  uVar41 = (uint)dVar5;
  uVar13 = pNtk->vPos->nSize + pNtk->vPis->nSize;
  uVar33 = (ulong)uVar13;
  dVar8 = (double)uVar41;
  dVar5 = (double)(int)(dVar4 / dVar8);
  dVar9 = dVar8 * dVar5;
  dStack_120 = local_128;
  local_128 = dVar9;
  printf("Core cell height(==site height) is %d\n",1);
  uVar39 = (ulong)(uint)(iVar1 + iVar37);
  printf("Total core cell width is %d giving an ave width of %f\n",
         SUB84((double)(uVar12 / uVar39),0),(ulong)uVar12,(ulong)uVar12 % uVar39);
  puts("Target Dimensions:");
  printf("  Area  :   %f\n",SUB84(dVar4,0));
  printf("  WS%%   :   %f\n",0);
  printf("  AR    :   %f\n",0);
  puts("Actual Dimensions:");
  local_88 = SUB84(dVar5,0);
  printf("  Width :   %f\n",local_88);
  printf("  Height:   %f (%d rows)\n",SUB84(dVar8,0),(ulong)uVar41);
  printf("  Area  :   %f\n",SUB84(dVar9,0));
  printf("  WS%%   :   %f\n",SUB84(((dVar9 - (double)uVar12) * 100.0) / dVar9,0));
  printf("  AR    :   %f\n\n",SUB84(dVar5 / dVar8,0));
  fwrite("UCLA    scl    1.0\n\n",0x14,1,pFVar19);
  fprintf(pFVar19,"Numrows : %d\n\n",(ulong)uVar41);
  if (uVar41 != 0) {
    uVar39 = 0;
    do {
      fwrite("CoreRow Horizontal\n",0x13,1,pFVar19);
      fprintf(pFVar19," Coordinate   : \t%d\n",uVar39);
      fprintf(pFVar19," Height       : \t%d\n",1);
      fprintf(pFVar19," Sitewidth    : \t%d\n",1);
      fprintf(pFVar19," Sitespacing  : \t%d\n",1);
      fprintf(pFVar19," Siteorient   : \t%s\n",
              &DAT_0098f614 + *(int *)(&DAT_0098f614 + (ulong)((uint)uVar39 & 1) * 4));
      fprintf(pFVar19," Sitesymmetry : \t%c\n",0x59);
      fprintf(pFVar19," SubrowOrigin : \t%d Numsites :    \t%d\n",0,
              (ulong)(uint)(int)(dVar4 / dVar8));
      fwrite("End\n",4,1,pFVar19);
      uVar12 = (uint)uVar39 + 1;
      uVar39 = (ulong)uVar12;
    } while (uVar41 != uVar12);
  }
  puVar22 = (uint *)malloc(0x10);
  uVar39 = 8;
  if (6 < uVar13 - 1) {
    uVar39 = uVar33;
  }
  puVar22[1] = 0;
  uVar12 = (uint)uVar39;
  *puVar22 = uVar12;
  if (uVar12 == 0) {
    pvVar23 = (void *)0x0;
  }
  else {
    pvVar23 = malloc((long)(int)uVar12 << 3);
  }
  uVar30 = (uint)((dVar8 / (dVar8 + dVar8 + dVar5 + dVar5)) * (double)uVar33);
  uVar49 = (ulong)uVar30;
  *(void **)(puVar22 + 2) = pvVar23;
  uVar12 = uVar30 * 2;
  uVar41 = uVar13 + uVar30 * -2;
  dVar4 = ceil((double)uVar41 * 0.5);
  pVVar29 = pNtk->vPis;
  if (0 < pVVar29->nSize) {
    lVar43 = 0;
    do {
      pvVar25 = pVVar29->pArray[lVar43];
      iVar37 = (int)uVar39;
      if ((int)lVar43 == iVar37) {
        if (iVar37 < 0x10) {
          if (pvVar23 == (void *)0x0) {
            pvVar23 = malloc(0x80);
          }
          else {
            pvVar23 = realloc(pvVar23,0x80);
          }
          uVar39 = 0x10;
        }
        else {
          uVar31 = iVar37 * 2;
          if (SBORROW4(iVar37,uVar31) != 0 < iVar37) {
            if (pvVar23 == (void *)0x0) {
              pvVar23 = malloc((ulong)uVar31 << 3);
            }
            else {
              pvVar23 = realloc(pvVar23,(ulong)uVar31 << 3);
            }
            uVar39 = (ulong)uVar31;
          }
        }
      }
      *(void **)((long)pvVar23 + lVar43 * 8) = pvVar25;
      lVar43 = lVar43 + 1;
      pVVar29 = pNtk->vPis;
    } while (lVar43 < pVVar29->nSize);
    puVar22[1] = (uint)lVar43;
    *puVar22 = (uint)uVar39;
    *(void **)(puVar22 + 2) = pvVar23;
  }
  pVVar29 = pNtk->vPos;
  if (0 < pVVar29->nSize) {
    uVar31 = *puVar22;
    uVar32 = puVar22[1];
    pvVar23 = *(void **)(puVar22 + 2);
    lVar43 = 0;
    do {
      pvVar25 = pVVar29->pArray[lVar43];
      if (uVar32 + (int)lVar43 == uVar31) {
        if ((int)uVar31 < 0x10) {
          if (pvVar23 == (void *)0x0) {
            pvVar23 = malloc(0x80);
          }
          else {
            pvVar23 = realloc(pvVar23,0x80);
          }
          uVar31 = 0x10;
        }
        else {
          uVar14 = uVar31 * 2;
          if (SBORROW4(uVar31,uVar14) != 0 < (int)uVar31) {
            uVar31 = uVar14;
            if (pvVar23 == (void *)0x0) {
              pvVar23 = malloc((ulong)uVar14 << 3);
            }
            else {
              pvVar23 = realloc(pvVar23,(ulong)uVar14 << 3);
            }
          }
        }
      }
      *(void **)((long)pvVar23 + lVar43 * 8 + (long)(int)uVar32 * 8) = pvVar25;
      lVar43 = lVar43 + 1;
      pVVar29 = pNtk->vPos;
    } while (lVar43 < pVVar29->nSize);
    puVar22[1] = uVar32 + (int)lVar43;
    *puVar22 = uVar31;
    *(void **)(puVar22 + 2) = pvVar23;
  }
  uVar31 = puVar22[1];
  pvVar23 = malloc((ulong)uVar31 << 2);
  puVar24 = (uint *)malloc(0x10);
  uVar32 = 8;
  if (6 < uVar31 - 1) {
    uVar32 = uVar31;
  }
  puVar24[1] = 0;
  *puVar24 = uVar32;
  if (uVar32 == 0) {
    pvVar25 = (void *)0x0;
  }
  else {
    pvVar25 = malloc((long)(int)uVar32 << 3);
  }
  *(void **)(puVar24 + 2) = pvVar25;
  if (uVar31 != 0) {
    memset(pvVar23,0,(ulong)uVar31 << 2);
  }
  if (0 < (int)uVar31) {
    local_108 = (long *)**(undefined8 **)(puVar22 + 2);
    p = Extra_ProgressBarStart((FILE *)_stdout,uVar31);
    uVar14 = 0;
    if (uVar31 != 1) {
      uVar14 = 0;
      local_f4 = 1;
      bVar47 = true;
      bVar48 = true;
      do {
        local_68 = (ulong)local_f4;
        while ((!bVar48 && (*(int *)((long)pvVar23 + (ulong)*(uint *)(local_108 + 2) * 4) != 0))) {
          if (((int)(uint)local_68 < 0) || ((int)puVar22[1] <= (int)local_f4)) goto LAB_0034039a;
          local_f4 = local_f4 + 1;
          local_108 = *(long **)(*(long *)(puVar22 + 2) + local_68 * 8);
          local_68 = local_68 + 1;
          bVar48 = false;
          if (!(bool)(bVar47 & local_f4 < uVar31)) goto LAB_0033fc8c;
        }
        uVar40 = puVar24[1];
        lVar43 = (long)(int)uVar40;
        if (0 < lVar43) {
          lVar34 = 0;
          do {
            if (*(long **)(*(long *)(puVar24 + 2) + lVar34 * 8) == local_108) goto LAB_0033f442;
            lVar34 = lVar34 + 1;
          } while (lVar43 != lVar34);
        }
        uVar15 = *puVar24;
        if (uVar40 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (*(void **)(puVar24 + 2) == (void *)0x0) {
              pvVar25 = malloc(0x80);
            }
            else {
              pvVar25 = realloc(*(void **)(puVar24 + 2),0x80);
            }
            uVar16 = 0x10;
          }
          else {
            uVar16 = uVar15 * 2;
            if ((int)uVar16 <= (int)uVar15) goto LAB_0033f40f;
            if (*(void **)(puVar24 + 2) == (void *)0x0) {
              pvVar25 = malloc((ulong)uVar15 << 4);
            }
            else {
              pvVar25 = realloc(*(void **)(puVar24 + 2),(ulong)uVar15 << 4);
            }
          }
          *(void **)(puVar24 + 2) = pvVar25;
          *puVar24 = uVar16;
        }
LAB_0033f40f:
        puVar24[1] = uVar40 + 1;
        *(long **)(*(long *)(puVar24 + 2) + lVar43 * 8) = local_108;
        *(undefined4 *)((long)pvVar23 + (ulong)*(uint *)(local_108 + 2) * 4) = 1;
        uVar14 = uVar14 + 1;
LAB_0033f442:
        puVar26 = (uint *)malloc(0x10);
        puVar26[1] = 0;
        *puVar26 = uVar32;
        pvVar25 = malloc((ulong)uVar32 << 3);
        *(void **)(puVar26 + 2) = pvVar25;
        if ((*(uint *)((long)local_108 + 0x14) & 0xe) != 2) {
          __assert_fail("Abc_ObjIsPi(pTerm) || Abc_ObjIsPo(pTerm)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                        ,0x312,
                        "Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)");
        }
        iVar37 = extraout_EDX;
        if ((pNtk->vTravIds).pArray == (int *)0x0) {
          iVar1 = pNtk->vObjs->nSize;
          uVar39 = (long)iVar1 + 500;
          iVar38 = (int)uVar39;
          if ((pNtk->vTravIds).nCap < iVar38) {
            piVar27 = (int *)malloc(uVar39 * 4);
            (pNtk->vTravIds).pArray = piVar27;
            if (piVar27 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (pNtk->vTravIds).nCap = iVar38;
            iVar37 = extraout_EDX_00;
          }
          if (-500 < iVar1) {
            memset((pNtk->vTravIds).pArray,0,(uVar39 & 0xffffffff) << 2);
            iVar37 = extraout_EDX_01;
          }
          (pNtk->vTravIds).nSize = iVar38;
        }
        iVar1 = pNtk->nTravIds;
        pNtk->nTravIds = iVar1 + 1;
        if (0x3ffffffe < iVar1) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        lVar43 = *local_108;
        uVar50 = *(undefined4 *)(lVar43 + 0xd8);
        iVar1 = (int)local_108[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar43 + 0xe0),iVar1 + 1,iVar37);
        if (((long)iVar1 < 0) || (*(int *)(lVar43 + 0xe4) <= iVar1)) {
LAB_00340410:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar43 + 0xe8) + (long)iVar1 * 4) = uVar50;
        lVar43 = *(long *)(*(long *)(*local_108 + 0x20) + 8);
        uVar40 = uVar32;
        if ((*(uint *)((long)local_108 + 0x14) & 0xf) == 2) {
          plVar46 = *(long **)(lVar43 + (long)*(int *)local_108[6] * 8);
          if (0 < *(int *)((long)plVar46 + 0x2c)) {
            lVar43 = 0;
            do {
              uVar36 = *(undefined8 *)
                        (*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                        (long)*(int *)(plVar46[6] + lVar43 * 4) * 8);
              if ((uint)lVar43 == uVar40) {
                if ((int)uVar40 < 0x10) {
                  if (pvVar25 == (void *)0x0) {
                    pvVar25 = malloc(0x80);
                  }
                  else {
                    pvVar25 = realloc(pvVar25,0x80);
                  }
                  uVar40 = 0x10;
                }
                else {
                  uVar15 = uVar40 * 2;
                  if (SBORROW4(uVar40,uVar15) != 0 < (int)uVar40) {
                    uVar40 = uVar15;
                    if (pvVar25 == (void *)0x0) {
                      pvVar25 = malloc((ulong)uVar15 << 3);
                    }
                    else {
                      pvVar25 = realloc(pvVar25,(ulong)uVar15 << 3);
                    }
                  }
                }
              }
              *(undefined8 *)((long)pvVar25 + lVar43 * 8) = uVar36;
              lVar43 = lVar43 + 1;
            } while (lVar43 < *(int *)((long)plVar46 + 0x2c));
LAB_0033f6bd:
            puVar26[1] = (uint)lVar43;
            *puVar26 = uVar40;
            *(void **)(puVar26 + 2) = pvVar25;
          }
        }
        else {
          plVar46 = *(long **)(lVar43 + (long)*(int *)local_108[4] * 8);
          if (0 < *(int *)((long)plVar46 + 0x1c)) {
            lVar43 = 0;
            do {
              uVar36 = *(undefined8 *)
                        (*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                        (long)*(int *)(plVar46[4] + lVar43 * 4) * 8);
              if ((uint)lVar43 == uVar40) {
                if ((int)uVar40 < 0x10) {
                  if (pvVar25 == (void *)0x0) {
                    pvVar25 = malloc(0x80);
                  }
                  else {
                    pvVar25 = realloc(pvVar25,0x80);
                  }
                  uVar40 = 0x10;
                }
                else {
                  uVar15 = uVar40 * 2;
                  if (SBORROW4(uVar40,uVar15) != 0 < (int)uVar40) {
                    uVar40 = uVar15;
                    if (pvVar25 == (void *)0x0) {
                      pvVar25 = malloc((ulong)uVar15 << 3);
                    }
                    else {
                      pvVar25 = realloc(pvVar25,(ulong)uVar15 << 3);
                    }
                  }
                }
              }
              *(undefined8 *)((long)pvVar25 + lVar43 * 8) = uVar36;
              lVar43 = lVar43 + 1;
            } while (lVar43 < *(int *)((long)plVar46 + 0x1c));
            goto LAB_0033f6bd;
          }
        }
        uVar40 = puVar26[1];
        if (0 < (int)uVar40) {
          local_118 = *(undefined8 **)(puVar26 + 2);
          do {
            plVar46 = (long *)*local_118;
            uVar15 = *(uint *)((long)plVar46 + 0x14) & 0xf;
            if ((3 < uVar15 - 2) && (uVar15 != 7)) {
              *(undefined8 **)(puVar26 + 2) = local_118;
              puVar26[1] = uVar40;
              __assert_fail("Abc_ObjIsNode(pNeighbor) || Abc_ObjIsTerm(pNeighbor)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                            ,0x325,
                            "Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)"
                           );
            }
            lVar43 = (ulong)uVar40 + 1;
            plVar44 = local_118 + uVar40;
            uVar15 = uVar40;
            do {
              uVar16 = uVar15;
              plVar35 = plVar44;
              if ((int)lVar43 + -1 < 1) {
                *(undefined8 **)(puVar26 + 2) = local_118;
                puVar26[1] = uVar40;
                __assert_fail("i >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
              }
              lVar34 = lVar43 + -1;
              lVar11 = lVar43 + -2;
              lVar43 = lVar34;
              plVar44 = plVar35 + -1;
              uVar15 = uVar16 - 1;
            } while ((long *)local_118[lVar11] != plVar46);
            uVar15 = (uint)lVar34;
            while ((int)uVar15 < (int)uVar40) {
              lVar34 = *plVar35;
              plVar35[-1] = lVar34;
              plVar35 = plVar35 + 1;
              uVar16 = uVar16 + 1;
              uVar15 = uVar16;
            }
            uVar40 = uVar40 - 1;
            local_128._0_4_ = uVar40;
            lVar43 = *plVar46;
            iVar37 = (int)plVar46[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar43 + 0xe0),iVar37 + 1,(int)lVar34);
            if (((long)iVar37 < 0) || (*(int *)(lVar43 + 0xe4) <= iVar37)) {
              *(undefined8 **)(puVar26 + 2) = local_118;
LAB_003403d9:
              puVar26[1] = local_128._0_4_;
LAB_003403e0:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar34 = *plVar46;
            iVar1 = *(int *)(lVar34 + 0xd8);
            if (*(int *)(*(long *)(lVar43 + 0xe8) + (long)iVar37 * 4) != iVar1) {
              iVar37 = (int)plVar46[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar34 + 0xe0),iVar37 + 1,Fill);
              if (((long)iVar37 < 0) || (*(int *)(lVar34 + 0xe4) <= iVar37)) {
                *(undefined8 **)(puVar26 + 2) = local_118;
                puVar26[1] = uVar40;
                goto LAB_00340410;
              }
              *(int *)(*(long *)(lVar34 + 0xe8) + (long)iVar37 * 4) = iVar1;
              if (((*(uint *)((long)plVar46 + 0x14) & 0xe) == 2) &&
                 (*(int *)((long)pvVar23 + (ulong)*(uint *)(plVar46 + 2) * 4) == 0)) break;
              uVar36 = extraout_RDX;
              if (*(int *)((long)plVar46 + 0x2c) != 0) {
                plVar44 = *(long **)(*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                                    (long)*(int *)plVar46[6] * 8);
                if ((pNtk->nObjCounts[8] != 0) && ((*(uint *)((long)plVar44 + 0x14) & 0xf) == 8)) {
                  plVar44 = *(long **)(*(long *)(*(long *)(*plVar44 + 0x20) + 8) +
                                      (long)*(int *)plVar44[6] * 8);
                  plVar44 = *(long **)(*(long *)(*(long *)(*plVar44 + 0x20) + 8) +
                                      (long)*(int *)plVar44[6] * 8);
                }
                if (0 < *(int *)((long)plVar44 + 0x2c)) {
                  lVar43 = 0;
                  do {
                    plVar35 = *(long **)(*(long *)(*(long *)(*plVar44 + 0x20) + 8) +
                                        (long)*(int *)(plVar44[6] + lVar43 * 4) * 8);
                    lVar34 = *plVar35;
                    iVar37 = (int)plVar35[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar34 + 0xe0),iVar37 + 1,(int)uVar36);
                    if (((long)iVar37 < 0) || (*(int *)(lVar34 + 0xe4) <= iVar37)) {
                      *(undefined8 **)(puVar26 + 2) = local_118;
                      puVar26[1] = local_128._0_4_;
                      goto LAB_003403e0;
                    }
                    uVar36 = extraout_RDX_00;
                    if (*(int *)(*(long *)(lVar34 + 0xe8) + (long)iVar37 * 4) !=
                        *(int *)(*plVar35 + 0xd8)) {
                      uVar40 = *puVar26;
                      if (local_128._0_4_ == uVar40) {
                        if ((int)uVar40 < 0x10) {
                          if (local_118 == (undefined8 *)0x0) {
                            local_118 = (undefined8 *)malloc(0x80);
                            uVar36 = extraout_RDX_03;
                          }
                          else {
                            local_118 = (undefined8 *)realloc(local_118,0x80);
                            uVar36 = extraout_RDX_01;
                          }
                          uVar15 = 0x10;
                        }
                        else {
                          uVar15 = uVar40 * 2;
                          if ((int)uVar15 <= (int)uVar40) goto LAB_0033f94b;
                          if (local_118 == (undefined8 *)0x0) {
                            local_118 = (undefined8 *)malloc((ulong)uVar40 << 4);
                            uVar36 = extraout_RDX_04;
                          }
                          else {
                            local_118 = (undefined8 *)realloc(local_118,(ulong)uVar40 << 4);
                            uVar36 = extraout_RDX_02;
                          }
                        }
                        *puVar26 = uVar15;
                      }
LAB_0033f94b:
                      lVar34 = (long)(int)local_128._0_4_;
                      local_128._0_4_ = local_128._0_4_ + 1;
                      local_118[lVar34] = plVar35;
                    }
                    lVar43 = lVar43 + 1;
                  } while (lVar43 < *(int *)((long)plVar44 + 0x2c));
                }
              }
              if (*(int *)((long)plVar46 + 0x1c) != 0) {
                if ((pNtk->nObjCounts[8] != 0) &&
                   (plVar44 = *(long **)(*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                                        (long)*(int *)plVar46[4] * 8),
                   (*(uint *)((long)plVar44 + 0x14) & 0xf) == 8)) {
                  plVar46 = *(long **)(*(long *)(*(long *)(*plVar44 + 0x20) + 8) +
                                      (long)*(int *)plVar44[4] * 8);
                }
                if (0 < *(int *)((long)plVar46 + 0x1c)) {
                  lVar43 = 0;
                  do {
                    plVar44 = *(long **)(*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                                        (long)*(int *)(plVar46[4] + lVar43 * 4) * 8);
                    plVar44 = *(long **)(*(long *)(*(long *)(*plVar44 + 0x20) + 8) +
                                        (long)*(int *)plVar44[4] * 8);
                    lVar34 = *plVar44;
                    iVar37 = (int)plVar44[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar34 + 0xe0),iVar37 + 1,(int)uVar36);
                    if (((long)iVar37 < 0) || (*(int *)(lVar34 + 0xe4) <= iVar37)) {
                      *(undefined8 **)(puVar26 + 2) = local_118;
                      goto LAB_003403d9;
                    }
                    uVar36 = extraout_RDX_05;
                    if (*(int *)(*(long *)(lVar34 + 0xe8) + (long)iVar37 * 4) !=
                        *(int *)(*plVar44 + 0xd8)) {
                      uVar40 = *puVar26;
                      if (local_128._0_4_ == uVar40) {
                        if ((int)uVar40 < 0x10) {
                          if (local_118 == (undefined8 *)0x0) {
                            local_118 = (undefined8 *)malloc(0x80);
                            uVar36 = extraout_RDX_08;
                          }
                          else {
                            local_118 = (undefined8 *)realloc(local_118,0x80);
                            uVar36 = extraout_RDX_06;
                          }
                          uVar15 = 0x10;
                        }
                        else {
                          uVar15 = uVar40 * 2;
                          if ((int)uVar15 <= (int)uVar40) goto LAB_0033fab6;
                          if (local_118 == (undefined8 *)0x0) {
                            local_118 = (undefined8 *)malloc((ulong)uVar40 << 4);
                            uVar36 = extraout_RDX_09;
                          }
                          else {
                            local_118 = (undefined8 *)realloc(local_118,(ulong)uVar40 << 4);
                            uVar36 = extraout_RDX_07;
                          }
                        }
                        *puVar26 = uVar15;
                      }
LAB_0033fab6:
                      lVar34 = (long)(int)local_128._0_4_;
                      local_128._0_4_ = local_128._0_4_ + 1;
                      local_118[lVar34] = plVar44;
                    }
                    lVar43 = lVar43 + 1;
                  } while (lVar43 < *(int *)((long)plVar46 + 0x1c));
                }
              }
            }
            uVar40 = local_128._0_4_;
            plVar46 = local_108;
          } while (0 < (int)local_128._0_4_);
          local_108 = plVar46;
          *(undefined8 **)(puVar26 + 2) = local_118;
        }
        puVar26[1] = uVar40;
        uVar40 = puVar24[1];
        lVar43 = (long)(int)uVar40;
        if (0 < lVar43) {
          lVar34 = 0;
          do {
            if (*(long **)(*(long *)(puVar24 + 2) + lVar34 * 8) == local_108) {
              bVar48 = false;
              goto LAB_0033fbb7;
            }
            lVar34 = lVar34 + 1;
          } while (lVar43 != lVar34);
        }
        uVar15 = *puVar24;
        if (uVar40 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (*(void **)(puVar24 + 2) == (void *)0x0) {
              pvVar25 = malloc(0x80);
            }
            else {
              pvVar25 = realloc(*(void **)(puVar24 + 2),0x80);
            }
            uVar16 = 0x10;
          }
          else {
            uVar16 = uVar15 * 2;
            if ((int)uVar16 <= (int)uVar15) goto LAB_0033fba1;
            if (*(void **)(puVar24 + 2) == (void *)0x0) {
              pvVar25 = malloc((ulong)uVar15 << 4);
            }
            else {
              pvVar25 = realloc(*(void **)(puVar24 + 2),(ulong)uVar15 << 4);
            }
          }
          *(void **)(puVar24 + 2) = pvVar25;
          *puVar24 = uVar16;
        }
LAB_0033fba1:
        puVar24[1] = uVar40 + 1;
        *(long **)(*(long *)(puVar24 + 2) + lVar43 * 8) = local_108;
        bVar48 = true;
LAB_0033fbb7:
        if (bVar48) {
          *(undefined4 *)((long)pvVar23 + (ulong)*(uint *)(local_108 + 2) * 4) = 1;
          uVar14 = uVar14 + 1;
        }
        else {
          if (((int)local_f4 < 0) || ((int)puVar22[1] <= (int)local_f4)) goto LAB_0034039a;
          local_f4 = local_f4 + 1;
          local_108 = *(long **)(*(long *)(puVar22 + 2) + (ulong)((uint)local_68 & 0x7fffffff) * 8);
        }
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= (int)uVar14)) {
          Extra_ProgressBarUpdate_int(p,uVar14,(char *)0x0);
        }
        bVar47 = uVar14 < uVar31;
      } while ((bVar47) && (local_f4 < uVar31));
    }
LAB_0033fc8c:
    Extra_ProgressBarStop(p);
    if (uVar14 != uVar31) {
      __assert_fail("termCount==numTerms",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                    ,0x2fc,"Vec_Ptr_t *Io_NtkOrderingPads(Abc_Ntk_t *, Vec_Ptr_t *)");
    }
    uVar31 = puVar24[1];
    if (uVar31 != uVar13) {
      __assert_fail("termsOnTop+termsOnBottom+termsOnLeft+termsOnRight == (unsigned)Vec_PtrSize(vOrderedTerms)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                    ,0x26d,"void Io_NtkWritePl(FILE *, Abc_Ntk_t *, unsigned int, double, double)");
    }
    uVar39 = (ulong)dVar4;
    uVar41 = uVar41 - (int)uVar39;
    puts("Done constructing layout region");
    uVar45 = 0;
    printf("Terminals: %d\n",uVar33);
    printf("  Top:     %d\n",uVar49);
    printf("  Bottom:  %d\n",uVar49);
    printf("  Left:    %d\n",(ulong)uVar41);
    printf("  Right:   %d\n",uVar39 & 0xffffffff);
    fwrite("UCLA    pl    1.0\n\n",0x13,1,pFVar20);
    dVar4 = dVar8 / (double)uVar49;
    if (uVar30 != 0) {
      dVar9 = ceil(dVar5 + 2.0);
      uVar42 = 0;
      if (0 < (int)uVar31) {
        uVar42 = (ulong)uVar31;
      }
      dVar10 = 0.0;
      uVar45 = 0;
      do {
        if (uVar42 == uVar45) goto LAB_0034039a;
        plVar46 = *(long **)(*(long *)(puVar24 + 2) + uVar45 * 8);
        bVar48 = (*(uint *)((long)plVar46 + 0x14) & 0xf) == 2;
        pcVar18 = "o%s_output\t\t";
        if (bVar48) {
          pcVar18 = "i%s_input\t\t";
        }
        pcVar28 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                               (long)*(int *)plVar46[(ulong)bVar48 * 2 + 4] * 8));
        fprintf(pFVar20,pcVar18,pcVar28);
        if ((uVar45 != 0) && ((int)dVar10 <= (int)(dVar10 - dVar4))) {
          dVar10 = dVar10 + 1.0;
        }
        fprintf(pFVar20,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar10,(ulong)(uint)(int)dVar9,
                "FS");
        dVar10 = dVar10 + dVar4;
        uVar45 = uVar45 + 1;
      } while (uVar49 != uVar45);
    }
    if ((uint)uVar45 < uVar12) {
      uVar45 = uVar45 & 0xffffffff;
      dVar9 = 0.0;
      do {
        if (((int)uVar45 < 0) || ((int)uVar31 <= (int)uVar45)) goto LAB_0034039a;
        plVar46 = *(long **)(*(long *)(puVar24 + 2) + uVar45 * 8);
        bVar48 = (*(uint *)((long)plVar46 + 0x14) & 0xf) == 2;
        pcVar18 = "o%s_output\t\t";
        if (bVar48) {
          pcVar18 = "i%s_input\t\t";
        }
        pcVar28 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                               (long)*(int *)plVar46[(ulong)bVar48 * 2 + 4] * 8));
        fprintf(pFVar20,pcVar18,pcVar28);
        if ((uVar49 != uVar45) && ((int)dVar9 <= (int)(dVar9 - dVar4))) {
          dVar9 = dVar9 + 1.0;
        }
        fprintf(pFVar20,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar9,0xfffffffd,"N");
        dVar9 = dVar9 + dVar4;
        uVar45 = uVar45 + 1;
      } while (uVar12 != uVar45);
    }
    if ((uint)uVar45 < uVar12 + uVar41) {
      dVar9 = dVar5 / (double)uVar41;
      uVar45 = uVar45 & 0xffffffff;
      dVar4 = 0.0;
      uVar50 = 0;
      uVar51 = 0;
      do {
        auVar2._8_4_ = uVar50;
        auVar2._0_8_ = dVar4;
        auVar2._12_4_ = uVar51;
        if (((int)uVar45 < 0) || ((int)uVar31 <= (int)uVar45)) goto LAB_0034039a;
        plVar46 = *(long **)(*(long *)(puVar24 + 2) + uVar45 * 8);
        bVar48 = (*(uint *)((long)plVar46 + 0x14) & 0xf) == 2;
        pcVar18 = "o%s_output\t\t";
        if (bVar48) {
          pcVar18 = "i%s_input\t\t";
        }
        pcVar28 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                               (long)*(int *)plVar46[(ulong)bVar48 * 2 + 4] * 8));
        fprintf(pFVar20,pcVar18,pcVar28);
        dStack_110 = auVar2._8_8_;
        uVar42 = -(ulong)((double)(int)dVar4 < (double)(int)(dVar4 - dVar9) + 1.0);
        uVar49 = (ulong)dStack_110 & (ulong)(double)(int)dStack_110;
        auVar52._0_8_ = ~uVar42 & (ulong)dVar4;
        auVar52._8_8_ = ~(ulong)(double)(int)dStack_110 & (ulong)dStack_110;
        auVar6._8_4_ = (int)uVar49;
        auVar6._0_8_ = (ulong)(dVar4 + 1.0) & uVar42;
        auVar6._12_4_ = (int)(uVar49 >> 0x20);
        auVar52 = auVar52 | auVar6;
        fprintf(pFVar20,"%d\t\t%d\t: %s /FIXED\n",0xfffffffd,(ulong)(uint)(int)auVar52._0_8_,"E");
        uVar50 = auVar52._8_4_;
        uVar51 = auVar52._12_4_;
        dVar4 = auVar52._0_8_ + dVar9;
        uVar45 = uVar45 + 1;
      } while (uVar13 - (int)uVar39 != uVar45);
    }
    if ((uint)uVar45 < uVar13) {
      dVar5 = dVar5 / (double)(uVar39 & 0xffffffff);
      dVar4 = ceil(dVar8 + 2.0);
      uVar45 = uVar45 & 0xffffffff;
      dVar8 = 0.0;
      uVar50 = 0;
      uVar51 = 0;
      do {
        auVar3._8_4_ = uVar50;
        auVar3._0_8_ = dVar8;
        auVar3._12_4_ = uVar51;
        if (((int)uVar45 < 0) || ((int)uVar31 <= (int)uVar45)) goto LAB_0034039a;
        plVar46 = *(long **)(*(long *)(puVar24 + 2) + uVar45 * 8);
        bVar48 = (*(uint *)((long)plVar46 + 0x14) & 0xf) == 2;
        pcVar18 = "o%s_output\t\t";
        if (bVar48) {
          pcVar18 = "i%s_input\t\t";
        }
        pcVar28 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar46 + 0x20) + 8) +
                               (long)*(int *)plVar46[(ulong)bVar48 * 2 + 4] * 8));
        fprintf(pFVar20,pcVar18,pcVar28);
        dStack_120 = auVar3._8_8_;
        uVar49 = -(ulong)((double)(int)dVar8 < (double)(int)(dVar8 - dVar5) + 1.0);
        uVar39 = (ulong)dStack_120 & (ulong)(double)(int)dStack_120;
        auVar53._0_8_ = ~uVar49 & (ulong)dVar8;
        auVar53._8_8_ = ~(ulong)(double)(int)dStack_120 & (ulong)dStack_120;
        auVar7._8_4_ = (int)uVar39;
        auVar7._0_8_ = (ulong)(dVar8 + 1.0) & uVar49;
        auVar7._12_4_ = (int)(uVar39 >> 0x20);
        auVar53 = auVar53 | auVar7;
        fprintf(pFVar20,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar4,
                (ulong)(uint)(int)auVar53._0_8_,"FW");
        uVar50 = auVar53._8_4_;
        uVar51 = auVar53._12_4_;
        dVar8 = auVar53._0_8_ + dVar5;
        uVar45 = uVar45 + 1;
      } while (uVar33 != uVar45);
    }
    if ((pNtk->nObjCounts[8] != 0) && (pVVar29 = pNtk->vBoxes, 0 < pVVar29->nSize)) {
      lVar43 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar29->pArray[lVar43])->field_0x14 & 0xf) == 8) {
          Io_NtkWriteLatchNode((FILE *)pFVar20,(Abc_Obj_t *)pVVar29->pArray[lVar43],1);
          fprintf(pFVar20,"\t%d\t\t%d\t: %s\n",0,0,"N");
        }
        lVar43 = lVar43 + 1;
        pVVar29 = pNtk->vBoxes;
      } while (lVar43 < pVVar29->nSize);
    }
    pVVar29 = pNtk->vObjs;
    if (0 < pVVar29->nSize) {
      lVar43 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar29->pArray[lVar43];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          Io_NtkWriteIntNode((FILE *)pFVar20,pNode,1);
          fprintf(pFVar20,"\t%d\t\t%d\t: %s\n",0,0,"N");
        }
        lVar43 = lVar43 + 1;
        pVVar29 = pNtk->vObjs;
      } while (lVar43 < pVVar29->nSize);
    }
    fclose(pFVar19);
    fclose(pFVar20);
    fclose(pFVar21);
    return;
  }
LAB_0034039a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Io_WriteBook( Abc_Ntk_t * pNtk, char * FileName )
{

    FILE * pFileNodes, * pFileNets, * pFileAux;
    FILE * pFileScl, * pFilePl, * pFileWts;
    char * FileExt = ABC_CALLOC( char, strlen(FileName)+7 );
    unsigned coreCellArea=0;
    Abc_Ntk_t * pExdc, * pNtkTemp;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the files
    strcpy(FileExt, FileName);
    pFileNodes = fopen( strcat(FileExt,".nodes"), "w" );
    strcpy(FileExt, FileName);
    pFileNets  = fopen( strcat(FileExt,".nets"), "w" );
    strcpy(FileExt, FileName);
    pFileAux   = fopen( strcat(FileExt,".aux"), "w" );

        // write the aux file
    if ( (pFileNodes == NULL) || (pFileNets == NULL) || (pFileAux == NULL) )
    {
        fclose( pFileAux );
        fprintf( stdout, "Io_WriteBook(): Cannot open the output files.\n" );
        return;
    }
    fprintf( pFileAux, "RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts", 
         FileName, FileName, FileName, FileName, FileName );
    fclose( pFileAux );

    // write the master network
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
    Io_NtkWriteNets( pFileNets, pNtk );

    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
    {
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
        Io_NtkWriteNets( pFileNets, pNtk );
    }

    // make sure there is no logic hierarchy
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // write the hierarchy if present
    if ( Abc_NtkBlackboxNum(pNtk) > 0 )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtkTemp );
            Io_NtkWriteNets( pFileNets, pNtkTemp );
        }
    }
    fclose( pFileNodes );
    fclose( pFileNets );

    strcpy(FileExt, FileName);
    pFileScl = fopen( strcat(FileExt,".scl"), "w" );
    strcpy(FileExt, FileName);
    pFilePl  = fopen( strcat(FileExt,".pl"), "w" );
    strcpy(FileExt, FileName);
    pFileWts   = fopen( strcat(FileExt,".wts"), "w" );
    ABC_FREE(FileExt);

    Io_NtkBuildLayout( pFileScl, pFilePl, pNtk, 1.0, 10, coreCellArea );
    fclose( pFileScl );
    fclose( pFilePl );
    fclose( pFileWts );
}